

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,xmlSchemaParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlSchemaTypeType xVar2;
  xmlSchemaContentType xVar3;
  xmlSchemaParserCtxtPtr elemDecl_00;
  xmlSchemaTypePtr pxVar4;
  xmlSchemaTypePtr pxVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  xmlSchemaParserCtxtPtr item;
  xmlChar *pxVar13;
  xmlChar *pxVar14;
  xmlChar *str3;
  xmlNodePtr pxVar15;
  xmlSchemaSubstGroupPtr group;
  xmlHashTablePtr pxVar16;
  xmlSchemaItemListPtr pxVar17;
  xmlSchemaParserCtxtPtr type;
  xmlParserErrors error;
  xmlSchemaParserCtxtPtr pxVar18;
  xmlSchemaTypePtr pxVar19;
  char *pcVar20;
  xmlSchemaTypePtr pxVar21;
  xmlSchemaElementPtr head;
  xmlSchemaElementPtr head_1;
  _xmlSchemaElement *head_00;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlChar *local_38;
  
  if (elemDecl == (xmlSchemaElementPtr)0x0) {
    return;
  }
  if (((uint)elemDecl->flags >> 0x12 & 1) != 0) {
    return;
  }
  elemDecl->flags = elemDecl->flags | 0x40000;
  type = (xmlSchemaParserCtxtPtr)elemDecl->subtypes;
  elemDecl_00 = (xmlSchemaParserCtxtPtr)elemDecl->refDecl;
  pxVar18 = ctxt;
  if (elemDecl_00 == (xmlSchemaParserCtxtPtr)0x0) {
    uVar12 = 0;
  }
  else {
    xmlSchemaCheckElementDeclComponent((xmlSchemaElementPtr)elemDecl_00,ctxt);
    uVar12 = 0;
    if ((elemDecl->flags & 2) == 0) {
      uVar12 = 0xbe6;
      pxVar18 = (xmlSchemaParserCtxtPtr)0xbe6;
      xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_E_PROPS_CORRECT_3,(xmlSchemaBasicItemPtr)elemDecl,
                          (xmlNodePtr)0x0,
                          "Only global element declarations can have a substitution group affiliation"
                          ,(xmlChar *)0x0);
    }
    item = elemDecl_00;
    if ((elemDecl_00 == (xmlSchemaParserCtxtPtr)elemDecl) ||
       (((xmlSchemaWildcardPtr)elemDecl_00->dict != (xmlSchemaWildcardPtr)0x0 &&
        (pxVar18 = elemDecl_00,
        item = (xmlSchemaParserCtxtPtr)
               xmlSchemaCheckSubstGroupCircular
                         ((xmlSchemaElementPtr)elemDecl_00,(xmlSchemaElementPtr)elemDecl_00),
        item != (xmlSchemaParserCtxtPtr)0x0)))) {
      local_40 = (xmlChar *)0x0;
      local_48 = (xmlChar *)0x0;
      pxVar13 = xmlSchemaGetComponentQName(&local_40,item);
      pxVar14 = xmlSchemaGetComponentQName(&local_48,elemDecl_00);
      pxVar18 = (xmlSchemaParserCtxtPtr)0xbe9;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_6,(xmlSchemaBasicItemPtr)item,(xmlNodePtr)0x0,
                 "The element declaration \'%s\' defines a circular substitution group to element declaration \'%s\'"
                 ,pxVar13,pxVar14,(xmlChar *)0x0);
      if (local_40 != (xmlChar *)0x0) {
        (*xmlFree)(local_40);
      }
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
      }
      uVar12 = 0xbe9;
    }
    if ((type != (xmlSchemaParserCtxtPtr)elemDecl->refDecl->subtypes) &&
       (pxVar18 = type,
       iVar9 = xmlSchemaCheckCOSDerivedOK
                         ((xmlSchemaAbstractCtxtPtr)ctxt,(xmlSchemaTypePtr)type,
                          *(xmlSchemaTypePtr *)&elemDecl_00->ownsConstructor,
                          *(uint *)&elemDecl_00->doc >> 0x10 & 1 |
                          *(uint *)&elemDecl_00->doc >> 0xe & 2), iVar9 != 0)) {
      local_40 = (xmlChar *)0x0;
      local_48 = (xmlChar *)0x0;
      local_38 = (xmlChar *)0x0;
      pxVar13 = xmlSchemaGetComponentQName(&local_40,type);
      pxVar14 = xmlSchemaGetComponentQName(&local_48,elemDecl_00);
      str3 = xmlSchemaGetComponentQName
                       (&local_38,*(xmlSchemaTypePtr *)&elemDecl_00->ownsConstructor);
      pxVar18 = (xmlSchemaParserCtxtPtr)0xbe7;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_E_PROPS_CORRECT_4,(xmlSchemaBasicItemPtr)elemDecl,(xmlNodePtr)0x0,
                 "The type definition \'%s\' was either rejected by the substitution group affiliation \'%s\', or not validly derived from its type definition \'%s\'"
                 ,pxVar13,pxVar14,str3);
      if (local_40 != (xmlChar *)0x0) {
        (*xmlFree)(local_40);
      }
      if (local_48 != (xmlChar *)0x0) {
        (*xmlFree)(local_48);
      }
      if (local_38 != (xmlChar *)0x0) {
        (*xmlFree)(local_38);
      }
      uVar12 = 0xbe7;
    }
  }
  iVar9 = (int)pxVar18;
  if (elemDecl->value == (xmlChar *)0x0) goto LAB_00196f5d;
  xVar2 = type->type;
  if (xVar2 == XML_SCHEMA_TYPE_COMPLEX) {
LAB_00196e4f:
    if (((*(xmlSchemaContentType *)((long)&type->doc + 4) | XML_SCHEMA_CONTENT_ELEMENTS) ==
         XML_SCHEMA_CONTENT_BASIC) &&
       (iVar9 = xmlSchemaIsDerivedFromBuiltInType(*(xmlSchemaTypePtr *)&type->xsiAssemble,iVar9),
       iVar9 != 0)) {
LAB_00196e6b:
      pcVar20 = 
      "The type definition (or type definition\'s content type) is or is derived from ID; value constraints are not allowed in conjunction with such a type definition"
      ;
      error = XML_SCHEMAP_E_PROPS_CORRECT_5;
      pxVar15 = (xmlNodePtr)0x0;
      type = (xmlSchemaParserCtxtPtr)elemDecl;
      goto LAB_001971ac;
    }
  }
  else {
    if (((xVar2 == XML_SCHEMA_TYPE_SIMPLE) ||
        ((xVar2 == XML_SCHEMA_TYPE_BASIC && (*(int *)&type->ctxtType != 0x2d)))) &&
       (iVar10 = xmlSchemaIsDerivedFromBuiltInType((xmlSchemaTypePtr)type,iVar9), iVar10 != 0))
    goto LAB_00196e6b;
    if (*(int *)&type->ctxtType == 0x2d) goto LAB_00196e4f;
  }
  if (elemDecl->node == (xmlNode *)0x0) {
    pxVar15 = (xmlNodePtr)0x0;
  }
  else {
    pcVar20 = "fixed";
    if ((elemDecl->flags & 8) == 0) {
      pcVar20 = "default";
    }
    pxVar15 = (xmlNodePtr)xmlHasProp(elemDecl->node,(xmlChar *)pcVar20);
  }
  pxVar13 = elemDecl->value;
  xVar2 = type->type;
  if (((((xVar2 == XML_SCHEMA_TYPE_COMPLEX) || (*(int *)&type->ctxtType == 0x2d)) &&
       (xVar3 = *(xmlSchemaContentType *)((long)&type->doc + 4), xVar3 != XML_SCHEMA_CONTENT_BASIC))
      && (xVar3 != XML_SCHEMA_CONTENT_SIMPLE)) &&
     ((xVar3 != XML_SCHEMA_CONTENT_MIXED ||
      (iVar9 = xmlSchemaIsParticleEmptiable
                         ((xmlSchemaParticlePtr)*(xmlSchemaTypePtr *)&type->ownsConstructor),
      iVar9 == 0)))) {
    pxVar15 = *(xmlNodePtr *)&type->counter;
    pcVar20 = 
    "For a string to be a valid default, the type definition must be a simple type or a complex type with mixed content and a particle emptiable"
    ;
    error = XML_SCHEMAP_COS_VALID_DEFAULT_2_1;
LAB_001971ac:
    xmlSchemaPCustomErr(ctxt,error,(xmlSchemaBasicItemPtr)type,pxVar15,pcVar20,(xmlChar *)0x0);
    return;
  }
  if ((xVar2 != XML_SCHEMA_TYPE_SIMPLE) &&
     ((xVar2 != XML_SCHEMA_TYPE_BASIC || (*(int *)&type->ctxtType == 0x2d)))) {
    if ((*(xmlSchemaContentType *)((long)&type->doc + 4) | XML_SCHEMA_CONTENT_ELEMENTS) !=
        XML_SCHEMA_CONTENT_BASIC) goto LAB_00196f5d;
    type = *(xmlSchemaParserCtxtPtr *)&type->xsiAssemble;
  }
  uVar11 = xmlSchemaVCheckCVCSimpleType
                     ((xmlSchemaAbstractCtxtPtr)ctxt,pxVar15,(xmlSchemaTypePtr)type,pxVar13,
                      &elemDecl->defVal,1,1,0);
  if ((int)uVar11 < 0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaParseCheckCOSValidDefault",
               "calling xmlSchemaVCheckCVCSimpleType()");
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaElemCheckValConstr",
               "failed to validate the value constraint of an element declaration");
    return;
  }
  uVar12 = uVar11 | uVar12;
LAB_00196f5d:
  if (((uVar12 == 0) && (head_00 = elemDecl->refDecl, head_00 != (_xmlSchemaElement *)0x0)) &&
     ((elemDecl->flags & 0x10) == 0)) {
    for (; head_00 != (xmlSchemaElementPtr)0x0; head_00 = head_00->refDecl) {
      if (((uint)head_00->flags >> 0xd & 1) == 0) {
        pxVar4 = head_00->subtypes;
        pxVar19 = elemDecl->subtypes;
        if (pxVar4 != pxVar19) {
          uVar12 = (head_00->flags & 0x1800U) << 7;
          bVar6 = false;
          pxVar21 = pxVar19;
          bVar7 = false;
          while (((bVar8 = bVar7, pxVar21 != (xmlSchemaTypePtr)0x0 && (pxVar21 != pxVar4)) &&
                 (pxVar5 = pxVar21->baseType, pxVar21 != pxVar5))) {
            piVar1 = &pxVar21->flags;
            bVar7 = true;
            if (bVar8) {
              bVar7 = bVar6;
            }
            if ((*piVar1 & 2U) == 0) {
              bVar7 = bVar6;
            }
            bVar6 = bVar7;
            bVar7 = true;
            if (bVar8) {
              bVar7 = bVar8;
            }
            pxVar21 = pxVar5;
            if ((*piVar1 & 4U) == 0) {
              bVar7 = bVar8;
            }
          }
          do {
            pxVar19 = pxVar19->baseType;
            if ((pxVar19 == (xmlSchemaTypePtr)0x0) ||
               ((pxVar19->type != XML_SCHEMA_TYPE_COMPLEX && (pxVar19->builtInType != 0x2d))))
            break;
            uVar11 = uVar12 | 0x40000;
            if ((uVar12 >> 0x12 & 1) != 0) {
              uVar11 = uVar12;
            }
            if ((pxVar19->flags & 0x40000U) == 0) {
              uVar11 = uVar12;
            }
            uVar12 = uVar11 | 0x80000;
            if (uVar11 >> 0x13 != 0) {
              uVar12 = uVar11;
            }
            if ((pxVar19->flags & 0x80000U) == 0) {
              uVar12 = uVar11;
            }
          } while (pxVar19 != pxVar4);
          if ((uVar12 != 0) &&
             ((((uVar12 >> 0x12 & 1) != 0 && (bVar6)) || ((uVar12 >> 0x13 != 0 && (bVar8))))))
          goto LAB_001970c3;
        }
        group = xmlSchemaSubstGroupGet(ctxt,head_00);
        if (group == (xmlSchemaSubstGroupPtr)0x0) {
          if (ctxt->constructor->substGroups == (xmlHashTablePtr)0x0) {
            pxVar16 = xmlHashCreateDict(10,ctxt->dict);
            ctxt->constructor->substGroups = pxVar16;
            if (pxVar16 != (xmlHashTablePtr)0x0) goto LAB_001970fb;
          }
          else {
LAB_001970fb:
            group = (xmlSchemaSubstGroupPtr)(*xmlMalloc)(0x10);
            if (group == (xmlSchemaSubstGroupPtr)0x0) {
              xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
            }
            else {
              group->members = (xmlSchemaItemListPtr)0x0;
              group->head = head_00;
              pxVar17 = xmlSchemaItemListCreate();
              group->members = pxVar17;
              if (pxVar17 == (xmlSchemaItemListPtr)0x0) {
                xmlSchemaSubstGroupFree(group);
              }
              else {
                iVar9 = xmlHashAddEntry2(ctxt->constructor->substGroups,head_00->name,
                                         head_00->targetNamespace,group);
                if (iVar9 == 0) goto LAB_0019709f;
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaSubstGroupAdd",
                           "failed to add a new substitution container");
                xmlSchemaSubstGroupFree(group);
              }
            }
          }
        }
        else {
LAB_0019709f:
          xmlSchemaItemListAdd(group->members,elemDecl);
        }
        if (((uint)head_00->flags >> 0x11 & 1) == 0) {
          head_00->flags = head_00->flags | 0x20000;
        }
      }
LAB_001970c3:
    }
  }
  return;
}

Assistant:

static void
xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,
				   xmlSchemaParserCtxtPtr ctxt)
{
    if (elemDecl == NULL)
	return;
    if (elemDecl->flags & XML_SCHEMAS_ELEM_INTERNAL_CHECKED)
	return;
    elemDecl->flags |= XML_SCHEMAS_ELEM_INTERNAL_CHECKED;
    if (xmlSchemaCheckElemPropsCorrect(ctxt, elemDecl) == 0) {
	/*
	* Adds substitution group members.
	*/
	xmlSchemaCheckElemSubstGroup(ctxt, elemDecl);
    }
}